

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O0

void __thiscall
Refal2::CNodeList<Refal2::CUnit>::Duplicate
          (CNodeList<Refal2::CUnit> *this,CNodeType *fromNode,CNodeType *toNode,
          CNodeType **fromNodeCopy,CNodeType **toNodeCopy)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CNodeType **toNodeCopy_local;
  CNodeType **fromNodeCopy_local;
  CNodeType *toNode_local;
  CNodeType *fromNode_local;
  CNodeList<Refal2::CUnit> *this_local;
  
  if (fromNode == (CNodeType *)0x0 || toNode == (CNodeType *)0x0) {
    __assert_fail("fromNode != nullptr && toNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                  ,0x138,
                  "virtual void Refal2::CNodeList<Refal2::CUnit>::Duplicate(const CNodeType *, const CNodeType *, CNodeType *&, CNodeType *&) [T = Refal2::CUnit]"
                 );
  }
  iVar1 = (*this->_vptr_CNodeList[3])(this,fromNode);
  *fromNodeCopy = (CNodeType *)CONCAT44(extraout_var,iVar1);
  *toNodeCopy = *fromNodeCopy;
  toNode_local = fromNode;
  while (toNode_local != toNode) {
    toNode_local = toNode_local->next;
    iVar1 = (*this->_vptr_CNodeList[3])(this,toNode_local);
    (*toNodeCopy)->next = (CNode<Refal2::CUnit> *)CONCAT44(extraout_var_00,iVar1);
    (*toNodeCopy)->next->prev = *toNodeCopy;
    *toNodeCopy = (*toNodeCopy)->next;
  }
  return;
}

Assistant:

void CNodeList<T>::Duplicate( const CNodeType* fromNode,
	const CNodeType* toNode, CNodeType*& fromNodeCopy, CNodeType*& toNodeCopy )
{
	assert( fromNode != nullptr && toNode != nullptr );
	fromNodeCopy = Alloc( *fromNode );
	toNodeCopy = fromNodeCopy;
	while( fromNode != toNode ) {
		fromNode = fromNode->next;
		toNodeCopy->next = Alloc( *fromNode );
		toNodeCopy->next->prev = toNodeCopy;
		toNodeCopy = toNodeCopy->next;
	}
}